

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_writer.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::ZipWriter::Write(ZipWriter *this,string *filename,string *contents)

{
  size_type sVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  CodedOutputStream output;
  FileInfo info;
  
  info.name._M_dataplus._M_p = (pointer)&info.name.field_2;
  info.name._M_string_length = 0;
  info.name.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&info);
  sVar1 = filename->_M_string_length;
  info.offset = (*this->raw_output_->_vptr_ZeroCopyOutputStream[4])();
  info.size = (uint32_t)contents->_M_string_length;
  uVar3 = 0xffffffff;
  for (sVar4 = 0; contents->_M_string_length != sVar4; sVar4 = sVar4 + 1) {
    uVar3 = uVar3 >> 8 ^
            *(uint *)(kCRC32Table +
                     (ulong)(byte)((contents->_M_dataplus)._M_p[sVar4] ^ (byte)uVar3) * 4);
  }
  info.crc32 = ~uVar3;
  std::
  vector<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
  ::push_back(&this->files_,&info);
  io::CodedOutputStream::CodedOutputStream<google::protobuf::io::ZeroCopyOutputStream,void>
            (&output,this->raw_output_);
  io::CodedOutputStream::WriteLittleEndian32(&output,0x4034b50);
  WriteShort(&output,10);
  WriteShort(&output,0);
  WriteShort(&output,0);
  WriteShort(&output,0);
  WriteShort(&output,0x21);
  io::CodedOutputStream::WriteLittleEndian32(&output,info.crc32);
  io::CodedOutputStream::WriteLittleEndian32(&output,info.size);
  io::CodedOutputStream::WriteLittleEndian32(&output,info.size);
  WriteShort(&output,(uint16_t)sVar1);
  WriteShort(&output,0);
  io::CodedOutputStream::WriteRaw
            (&output,(filename->_M_dataplus)._M_p,(int)filename->_M_string_length);
  io::CodedOutputStream::WriteRaw
            (&output,(contents->_M_dataplus)._M_p,(int)contents->_M_string_length);
  bVar2 = io::CodedOutputStream::HadError(&output);
  io::CodedOutputStream::~CodedOutputStream(&output);
  std::__cxx11::string::~string((string *)&info);
  return !bVar2;
}

Assistant:

bool ZipWriter::Write(const std::string& filename,
                      const std::string& contents) {
  FileInfo info;

  info.name = filename;
  uint16_t filename_size = filename.size();
  info.offset = raw_output_->ByteCount();
  info.size = contents.size();
  info.crc32 = ComputeCRC32(contents);

  files_.push_back(info);

  // write file header
  io::CodedOutputStream output(raw_output_);
  output.WriteLittleEndian32(0x04034b50);  // magic
  WriteShort(&output, 10);                 // version needed to extract
  WriteShort(&output, 0);                  // flags
  WriteShort(&output, 0);                  // compression method: stored
  WriteShort(&output, 0);                  // last modified time
  WriteShort(&output, kDosEpoch);          // last modified date
  output.WriteLittleEndian32(info.crc32);  // crc-32
  output.WriteLittleEndian32(info.size);   // compressed size
  output.WriteLittleEndian32(info.size);   // uncompressed size
  WriteShort(&output, filename_size);      // file name length
  WriteShort(&output, 0);                  // extra field length
  output.WriteString(filename);            // file name
  output.WriteString(contents);            // file data

  return !output.HadError();
}